

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O0

ngx_int_t ngx_http_fastcgi_script_name_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_http_fastcgi_loc_conf_t *flcf_00;
  ngx_http_fastcgi_ctx_t *pnVar1;
  u_char *puVar2;
  ngx_http_fastcgi_loc_conf_t *flcf;
  ngx_http_fastcgi_ctx_t *f;
  u_char *p;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  flcf_00 = (ngx_http_fastcgi_loc_conf_t *)r->loc_conf[ngx_http_fastcgi_module.ctx_index];
  pnVar1 = ngx_http_fastcgi_split(r,flcf_00);
  if (pnVar1 == (ngx_http_fastcgi_ctx_t *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else if (((pnVar1->script_name).len == 0) ||
          ((pnVar1->script_name).data[(pnVar1->script_name).len - 1] != '/')) {
    *(uint *)v = *(uint *)v & 0xf0000000 | (uint)(pnVar1->script_name).len & 0xfffffff;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = (pnVar1->script_name).data;
    r_local = (ngx_http_request_t *)0x0;
  }
  else {
    *(uint *)v = *(uint *)v & 0xf0000000 |
                 (int)(pnVar1->script_name).len + (int)(flcf_00->index).len & 0xfffffffU;
    puVar2 = (u_char *)ngx_pnalloc(r->pool,(ulong)(*(uint *)v & 0xfffffff));
    v->data = puVar2;
    if (v->data == (u_char *)0x0) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      puVar2 = v->data;
      memcpy(puVar2,(pnVar1->script_name).data,(pnVar1->script_name).len);
      memcpy(puVar2 + (pnVar1->script_name).len,(flcf_00->index).data,(flcf_00->index).len);
      r_local = (ngx_http_request_t *)0x0;
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_script_name_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char                       *p;
    ngx_http_fastcgi_ctx_t       *f;
    ngx_http_fastcgi_loc_conf_t  *flcf;

    flcf = ngx_http_get_module_loc_conf(r, ngx_http_fastcgi_module);

    f = ngx_http_fastcgi_split(r, flcf);

    if (f == NULL) {
        return NGX_ERROR;
    }

    if (f->script_name.len == 0
        || f->script_name.data[f->script_name.len - 1] != '/')
    {
        v->len = f->script_name.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = f->script_name.data;

        return NGX_OK;
    }

    v->len = f->script_name.len + flcf->index.len;

    v->data = ngx_pnalloc(r->pool, v->len);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    p = ngx_copy(v->data, f->script_name.data, f->script_name.len);
    ngx_memcpy(p, flcf->index.data, flcf->index.len);

    return NGX_OK;
}